

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O2

aiReturn __thiscall
Assimp::Exporter::Export
          (Exporter *this,aiScene *pScene,char *pFormatId,char *pPath,uint pPreprocessing,
          ExportProperties *pProperties)

{
  pointer pEVar1;
  pointer pEVar2;
  ProgressHandler *pPVar3;
  void *pvVar4;
  pointer ppBVar5;
  BaseProcess *pBVar6;
  pointer pEVar7;
  bool bVar8;
  int iVar9;
  ExporterPimpl *pEVar10;
  ExportProperties *this_00;
  Logger *this_01;
  long lVar11;
  ScenePrivateData *pSVar12;
  pointer pEVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  unique_ptr<aiScene,_std::default_delete<aiScene>_> scenecopy;
  aiScene *scenecopy_tmp;
  ExportProperties emptyProperties;
  
  pEVar10 = this->pimpl;
  if (pEVar10 == (ExporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                  ,0x142,
                  "aiReturn Assimp::Exporter::Export(const aiScene *, const char *, const char *, unsigned int, const ExportProperties *)"
                 );
  }
  bVar8 = true;
  if ((pScene->mFlags & 8) != 0) {
    bVar8 = MakeVerboseFormatProcess::IsVerboseFormat(pScene);
    pEVar10 = this->pimpl;
  }
  (*pEVar10->mProgressHandler->_vptr_ProgressHandler[5])(pEVar10->mProgressHandler,0,4);
  std::__cxx11::string::assign((char *)&this->pimpl->mError);
  this_00 = &emptyProperties;
  if (pProperties != (ExportProperties *)0x0) {
    this_00 = pProperties;
  }
  pEVar1 = (this->pimpl->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->pimpl->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar15 = 0xffffffffffffffff;
  pEVar7 = pEVar1;
  do {
    pEVar13 = pEVar7;
    uVar15 = uVar15 + 1;
    if ((ulong)(((long)pEVar2 - (long)pEVar1) / 0x28) <= uVar15) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&scenecopy_tmp,"Found no exporter to handle this file format: ",
                 (allocator<char> *)&scenecopy);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &emptyProperties,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scenecopy_tmp,pFormatId);
      std::__cxx11::string::operator=((string *)&this->pimpl->mError,(string *)&emptyProperties);
      std::__cxx11::string::~string((string *)&emptyProperties);
      std::__cxx11::string::~string((string *)&scenecopy_tmp);
      return aiReturn_FAILURE;
    }
    iVar9 = strcmp((pEVar13->mDescription).id,pFormatId);
    pEVar7 = pEVar13 + 1;
  } while (iVar9 != 0);
  scenecopy_tmp = (aiScene *)0x0;
  SceneCombiner::CopyScene(&scenecopy_tmp,pScene,true);
  pPVar3 = this->pimpl->mProgressHandler;
  (*pPVar3->_vptr_ProgressHandler[5])(pPVar3,1,4);
  scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
  super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
  super__Head_base<0UL,_aiScene_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiScene,_std::default_delete<aiScene>,_true,_true>)
       (__uniq_ptr_data<aiScene,_std::default_delete<aiScene>,_true,_true>)scenecopy_tmp;
  pvVar4 = pScene->mPrivate;
  uVar14 = 0xffffffff;
  if ((pvVar4 != (void *)0x0) && (*(char *)((long)pvVar4 + 0xc) == '\0')) {
    uVar14 = ~*(uint *)((long)pvVar4 + 8) | 0x1800004;
  }
  uVar14 = uVar14 & (pPreprocessing | pEVar13->mEnforcePP);
  uVar15 = 0;
  if (bVar8 == false) {
    for (; ppBVar5 = (this->pimpl->mPostProcessingSteps).
                     super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
        uVar15 < (ulong)((long)(this->pimpl->mPostProcessingSteps).
                               super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar5 >> 3);
        uVar15 = (ulong)((int)uVar15 + 1)) {
      pBVar6 = ppBVar5[uVar15];
      iVar9 = (*pBVar6->_vptr_BaseProcess[2])(pBVar6,(ulong)uVar14);
      if (((char)iVar9 != '\0') &&
         (iVar9 = (*pBVar6->_vptr_BaseProcess[3])(pBVar6), (char)iVar9 != '\0')) goto LAB_0031493a;
    }
    if ((pEVar13->mEnforcePP & 2) == 0) {
      uVar15 = 0;
    }
    else {
LAB_0031493a:
      this_01 = DefaultLogger::get();
      Logger::debug(this_01,
                    "export: Scene data not in verbose format, applying MakeVerboseFormat step first"
                   );
      MakeVerboseFormatProcess::MakeVerboseFormatProcess
                ((MakeVerboseFormatProcess *)&emptyProperties);
      MakeVerboseFormatProcess::Execute
                ((MakeVerboseFormatProcess *)&emptyProperties,
                 (aiScene *)
                 scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
                 super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
                 super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
      uVar15 = (ulong)((pEVar13->mEnforcePP & 2) == 0);
      MakeVerboseFormatProcess::~MakeVerboseFormatProcess
                ((MakeVerboseFormatProcess *)&emptyProperties);
    }
  }
  pPVar3 = this->pimpl->mProgressHandler;
  (*pPVar3->_vptr_ProgressHandler[5])(pPVar3,2,4);
  if (uVar14 != 0) {
    FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)&emptyProperties);
    bVar8 = FlipWindingOrderProcess::IsActive((FlipWindingOrderProcess *)&emptyProperties,uVar14);
    if (bVar8) {
      FlipWindingOrderProcess::Execute
                ((FlipWindingOrderProcess *)&emptyProperties,
                 (aiScene *)
                 scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
                 super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
                 super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
    }
    FlipWindingOrderProcess::~FlipWindingOrderProcess((FlipWindingOrderProcess *)&emptyProperties);
    FlipUVsProcess::FlipUVsProcess((FlipUVsProcess *)&emptyProperties);
    bVar8 = FlipUVsProcess::IsActive((FlipUVsProcess *)&emptyProperties,uVar14);
    if (bVar8) {
      FlipUVsProcess::Execute
                ((FlipUVsProcess *)&emptyProperties,
                 (aiScene *)
                 scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
                 super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
                 super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
    }
    FlipUVsProcess::~FlipUVsProcess((FlipUVsProcess *)&emptyProperties);
    MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)&emptyProperties);
    bVar8 = MakeLeftHandedProcess::IsActive((MakeLeftHandedProcess *)&emptyProperties,uVar14);
    if (bVar8) {
      MakeLeftHandedProcess::Execute
                ((MakeLeftHandedProcess *)&emptyProperties,
                 (aiScene *)
                 scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
                 super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
                 super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
    }
    MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)&emptyProperties);
    uVar16 = 0;
    if (pProperties == (ExportProperties *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = ExportProperties::GetPropertyBool(pProperties,"EXPORT_POINT_CLOUDS",false);
      uVar16 = 0;
    }
    while( true ) {
      ppBVar5 = (this->pimpl->mPostProcessingSteps).
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->pimpl->mPostProcessingSteps).
                        super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar5 >> 3) <=
          (ulong)uVar16) break;
      pBVar6 = ppBVar5[uVar16];
      iVar9 = (*pBVar6->_vptr_BaseProcess[2])(pBVar6,(ulong)uVar14);
      if (((((char)iVar9 != '\0') &&
           (lVar11 = __dynamic_cast(pBVar6,&BaseProcess::typeinfo,&FlipUVsProcess::typeinfo,0),
           lVar11 == 0)) &&
          (lVar11 = __dynamic_cast(pBVar6,&BaseProcess::typeinfo,&FlipWindingOrderProcess::typeinfo,
                                   0), lVar11 == 0)) &&
         ((lVar11 = __dynamic_cast(pBVar6,&BaseProcess::typeinfo,&MakeLeftHandedProcess::typeinfo,0)
          , lVar11 == 0 &&
          (lVar11 = __dynamic_cast(pBVar6,&BaseProcess::typeinfo,&PretransformVertices::typeinfo,0),
          (bVar8 & lVar11 != 0) == 0)))) {
        (*pBVar6->_vptr_BaseProcess[5])
                  (pBVar6,scenecopy._M_t.
                          super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
                          super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
                          super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
      }
      uVar16 = uVar16 + 1;
    }
    pSVar12 = ScenePriv((aiScene *)
                        scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>
                        ._M_t.super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
                        super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
    if (pSVar12 == (ScenePrivateData *)0x0) {
      __assert_fail("nullptr != privOut",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                    ,0x1b2,
                    "aiReturn Assimp::Exporter::Export(const aiScene *, const char *, const char *, unsigned int, const ExportProperties *)"
                   );
    }
    pSVar12->mPPStepsApplied = pSVar12->mPPStepsApplied | uVar14;
  }
  pPVar3 = this->pimpl->mProgressHandler;
  (*pPVar3->_vptr_ProgressHandler[5])(pPVar3,3,4);
  if ((char)uVar15 != '\0') {
    JoinVerticesProcess::JoinVerticesProcess((JoinVerticesProcess *)&emptyProperties);
    JoinVerticesProcess::Execute
              ((JoinVerticesProcess *)&emptyProperties,
               (aiScene *)
               scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
               super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
               super__Head_base<0UL,_aiScene_*,_false>._M_head_impl);
    JoinVerticesProcess::~JoinVerticesProcess((JoinVerticesProcess *)&emptyProperties);
  }
  ExportProperties::ExportProperties(&emptyProperties);
  ExportProperties::SetPropertyBool(this_00,"bJoinIdenticalVertices",SUB41((uVar14 & 2) >> 1,0));
  (*pEVar13->mExportFunction)
            (pPath,(this->pimpl->mIOSystem).
                   super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (aiScene *)
             scenecopy._M_t.super___uniq_ptr_impl<aiScene,_std::default_delete<aiScene>_>._M_t.
             super__Tuple_impl<0UL,_aiScene_*,_std::default_delete<aiScene>_>.
             super__Head_base<0UL,_aiScene_*,_false>._M_head_impl,this_00);
  pPVar3 = this->pimpl->mProgressHandler;
  (*pPVar3->_vptr_ProgressHandler[5])(pPVar3,4);
  ExportProperties::~ExportProperties(&emptyProperties);
  std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::~unique_ptr(&scenecopy);
  return aiReturn_SUCCESS;
}

Assistant:

aiReturn Exporter::Export( const aiScene* pScene, const char* pFormatId, const char* pPath,
        unsigned int pPreprocessing, const ExportProperties* pProperties) {
    ASSIMP_BEGIN_EXCEPTION_REGION();
	ai_assert(nullptr != pimpl);
    // when they create scenes from scratch, users will likely create them not in verbose
    // format. They will likely not be aware that there is a flag in the scene to indicate
    // this, however. To avoid surprises and bug reports, we check for duplicates in
    // meshes upfront.
    const bool is_verbose_format = !(pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) || MakeVerboseFormatProcess::IsVerboseFormat(pScene);

    pimpl->mProgressHandler->UpdateFileWrite(0, 4);

    pimpl->mError = "";
    for (size_t i = 0; i < pimpl->mExporters.size(); ++i) {
        const Exporter::ExportFormatEntry& exp = pimpl->mExporters[i];
        if (!strcmp(exp.mDescription.id,pFormatId)) {
            try {
                // Always create a full copy of the scene. We might optimize this one day,
                // but for now it is the most pragmatic way.
                aiScene* scenecopy_tmp = nullptr;
                SceneCombiner::CopyScene(&scenecopy_tmp,pScene);

                pimpl->mProgressHandler->UpdateFileWrite(1, 4);

                std::unique_ptr<aiScene> scenecopy(scenecopy_tmp);
                const ScenePrivateData* const priv = ScenePriv(pScene);

                // steps that are not idempotent, i.e. we might need to run them again, usually to get back to the
                // original state before the step was applied first. When checking which steps we don't need
                // to run, those are excluded.
                const unsigned int nonIdempotentSteps = aiProcess_FlipWindingOrder | aiProcess_FlipUVs | aiProcess_MakeLeftHanded;

                // Erase all pp steps that were already applied to this scene
                const unsigned int pp = (exp.mEnforcePP | pPreprocessing) & ~(priv && !priv->mIsCopy
                    ? (priv->mPPStepsApplied & ~nonIdempotentSteps)
                    : 0u);

                // If no extra post-processing was specified, and we obtained this scene from an
                // Assimp importer, apply the reverse steps automatically.
                // TODO: either drop this, or document it. Otherwise it is just a bad surprise.
                //if (!pPreprocessing && priv) {
                //  pp |= (nonIdempotentSteps & priv->mPPStepsApplied);
                //}

                // If the input scene is not in verbose format, but there is at least post-processing step that relies on it,
                // we need to run the MakeVerboseFormat step first.
                bool must_join_again = false;
                if (!is_verbose_format) {
                    bool verbosify = false;
                    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++) {
                        BaseProcess* const p = pimpl->mPostProcessingSteps[a];

                        if (p->IsActive(pp) && p->RequireVerboseFormat()) {
                            verbosify = true;
                            break;
                        }
                    }

                    if (verbosify || (exp.mEnforcePP & aiProcess_JoinIdenticalVertices)) {
                        ASSIMP_LOG_DEBUG("export: Scene data not in verbose format, applying MakeVerboseFormat step first");

                        MakeVerboseFormatProcess proc;
                        proc.Execute(scenecopy.get());

                        if(!(exp.mEnforcePP & aiProcess_JoinIdenticalVertices)) {
                            must_join_again = true;
                        }
                    }
                }

                pimpl->mProgressHandler->UpdateFileWrite(2, 4);

                if (pp) {
                    // the three 'conversion' steps need to be executed first because all other steps rely on the standard data layout
                    {
                        FlipWindingOrderProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    {
                        FlipUVsProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    {
                        MakeLeftHandedProcess step;
                        if (step.IsActive(pp)) {
                            step.Execute(scenecopy.get());
                        }
                    }

                    bool exportPointCloud(false);
                    if (nullptr != pProperties) {
                        exportPointCloud = pProperties->GetPropertyBool(AI_CONFIG_EXPORT_POINT_CLOUDS);
                    }

                    // dispatch other processes
                    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++) {
                        BaseProcess* const p = pimpl->mPostProcessingSteps[a];

                        if (p->IsActive(pp)
                            && !dynamic_cast<FlipUVsProcess*>(p)
                            && !dynamic_cast<FlipWindingOrderProcess*>(p)
                            && !dynamic_cast<MakeLeftHandedProcess*>(p)) {
                            if (dynamic_cast<PretransformVertices*>(p) && exportPointCloud) {
                                continue;
                            }
                            p->Execute(scenecopy.get());
                        }
                    }
                    ScenePrivateData* const privOut = ScenePriv(scenecopy.get());
                    ai_assert(nullptr != privOut);

                    privOut->mPPStepsApplied |= pp;
                }

                pimpl->mProgressHandler->UpdateFileWrite(3, 4);

                if(must_join_again) {
                    JoinVerticesProcess proc;
                    proc.Execute(scenecopy.get());
                }

                ExportProperties emptyProperties;  // Never pass NULL ExportProperties so Exporters don't have to worry.
                ExportProperties* pProp = pProperties ? (ExportProperties*)pProperties : &emptyProperties;
        		pProp->SetPropertyBool("bJoinIdenticalVertices", pp & aiProcess_JoinIdenticalVertices);
                exp.mExportFunction(pPath,pimpl->mIOSystem.get(),scenecopy.get(), pProp);

                pimpl->mProgressHandler->UpdateFileWrite(4, 4);
            } catch (DeadlyExportError& err) {
                pimpl->mError = err.what();
                return AI_FAILURE;
            }
            return AI_SUCCESS;
        }
    }

    pimpl->mError = std::string("Found no exporter to handle this file format: ") + pFormatId;
    ASSIMP_END_EXCEPTION_REGION(aiReturn);

    return AI_FAILURE;
}